

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

cmSourceFile *
anon_unknown.dwarf_1692863::AddCustomCommand
          (cmLocalGenerator *lg,cmCommandOrigin origin,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,bool replace)

{
  cmCustomCommandLine *pcVar1;
  cmCustomCommandLine *pcVar2;
  cmCustomCommandLine *pcVar3;
  pointer pcVar4;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar5;
  cmake *this;
  cmListFileBacktrace *bt;
  bool bVar6;
  byte bVar7;
  cmCustomCommandLines *pcVar8;
  string *psVar9;
  cmMakefile *this_00;
  cmCustomCommand *pcVar10;
  cmCustomCommandLines *pcVar11;
  size_type sVar12;
  string *psVar13;
  cmMakefile *this_01;
  cmMakefile *this_02;
  string_view input;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string simple;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigOutputs;
  string outName;
  cmCryptoHash h;
  string local_128;
  cmListFileBacktrace *local_108;
  string local_100;
  cmMakefile *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [40];
  cmState *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  pointer local_78;
  cmGlobalGenerator *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  cmCryptoHash local_60;
  string local_50;
  
  this_02 = lg->Makefile;
  local_108 = cmCustomCommand::GetBacktrace
                        ((cc->_M_t).
                         super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                         .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_d8 = cmCustomCommand::GetOutputs_abi_cxx11_
                       ((cc->_M_t).
                        super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_68 = cmCustomCommand::GetByproducts_abi_cxx11_
                       ((cc->_M_t).
                        super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                        .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  pcVar8 = cmCustomCommand::GetCommandLines
                     ((cc->_M_t).
                      super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                      .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  local_e0 = this_02;
  if (((pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
       super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     (pcVar10 = (cc->_M_t).
                super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
     pcVar10->HasMainDependency_ != true)) {
    this_01 = (cmMakefile *)0x0;
  }
  else {
    psVar9 = cmCustomCommand::GetMainDependency_abi_cxx11_(pcVar10);
    this_00 = (cmMakefile *)cmMakefile::GetSource(this_02,psVar9,Ambiguous);
    if (this_00 == (cmMakefile *)0x0) {
      this_01 = (cmMakefile *)cmMakefile::CreateSource(this_02,psVar9,false,Ambiguous);
      bVar7 = 1;
    }
    else {
      pcVar10 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_00);
      bVar7 = 1;
      this_01 = this_00;
      if (pcVar10 != (cmCustomCommand *)0x0 && !replace) {
        pcVar10 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_00);
        pcVar11 = cmCustomCommand::GetCommandLines(pcVar10);
        pcVar1 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar2 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pcVar3 = (pcVar11->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((long)pcVar2 - (long)pcVar1 ==
            (long)(pcVar11->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>)
                  .super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) {
          bVar6 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                            (pcVar1,pcVar2,pcVar3);
        }
        else {
          bVar6 = false;
        }
        this_01 = (cmMakefile *)0x0;
        if (bVar6 != false) {
          this_01 = this_00;
        }
        bVar7 = bVar6 ^ 1;
      }
    }
    this_02 = this_00;
    if (bVar7 == 0) {
      return (cmSourceFile *)this_00;
    }
  }
  if (this_01 != (cmMakefile *)0x0) goto LAB_003d8183;
  local_70 = lg->GlobalGenerator;
  psVar9 = (local_d8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar12 = cmGeneratorExpression::Find(psVar9);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pcVar4 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar4,pcVar4 + psVar9->_M_string_length);
  if (sVar12 != 0xffffffffffffffff) {
    cmsys::SystemTools::ReplaceString(&local_128,"$<CONFIG>","(CONFIG)");
    sVar12 = cmGeneratorExpression::Find(&local_128);
    if (sVar12 != 0xffffffffffffffff) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      cmLocalGenerator::ExpandCustomCommandOutputGenex
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8,lg,psVar9,local_108);
      if (local_c8._8_8_ - local_c8._0_8_ == 0x20) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,*(long *)local_c8._0_8_,
                   (long)&((*(pointer *)(local_c8._0_8_ + 8))->CurrentScope).Tree +
                   *(long *)local_c8._0_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
        cmCryptoHash::cmCryptoHash(&local_60,AlgoSHA256);
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)local_c8,&(lg->super_cmOutputConverter).StateSnapshot);
        psVar13 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_c8);
        local_78 = (pointer)(psVar13->_M_dataplus)._M_p;
        pcVar5 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                 psVar13->_M_string_length;
        input._M_str = (psVar9->_M_dataplus)._M_p;
        input._M_len = psVar9->_M_string_length;
        cmCryptoHash::HashString_abi_cxx11_(&local_50,&local_60,input);
        std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_50);
        local_c8._8_8_ = local_78;
        local_b8._0_8_ = (cmState *)0xc;
        local_b8._8_8_ = (long)"**/CMakeFiles/" + 2;
        local_b8._16_8_ = local_100._M_string_length;
        local_b8._24_8_ = local_100._M_dataplus._M_p;
        views._M_len = 3;
        views._M_array = (iterator)local_c8;
        local_c8._0_8_ = pcVar5;
        cmCatViews_abi_cxx11_(&local_128,views);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmCryptoHash::~cmCryptoHash(&local_60);
      }
    }
  }
  (*local_70->_vptr_cmGlobalGenerator[0x33])(local_b8 + 0x20,local_70,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  this_01 = (cmMakefile *)cmMakefile::GetSource(local_e0,(string *)(local_b8 + 0x20),Known);
  if (this_01 == (cmMakefile *)0x0) {
    this_01 = (cmMakefile *)
              cmMakefile::CreateSource(local_e0,(string *)(local_b8 + 0x20),true,Known);
LAB_003d8103:
    local_c8._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"__CMAKE_RULE","");
    cmSourceFile::SetProperty((cmSourceFile *)this_01,(string *)local_c8,"1");
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_c8._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b8) {
      operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._0_8_ + 1));
    }
    bVar6 = true;
  }
  else {
    pcVar10 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_01);
    if (pcVar10 == (cmCustomCommand *)0x0 || replace) goto LAB_003d8103;
    pcVar10 = cmSourceFile::GetCustomCommand((cmSourceFile *)this_01);
    pcVar11 = cmCustomCommand::GetCommandLines(pcVar10);
    pcVar1 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (pcVar8->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar3 = (pcVar11->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)pcVar2 - (long)pcVar1 !=
         (long)(pcVar11->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)pcVar3) ||
       (bVar6 = std::__equal<false>::equal<cmCustomCommandLine_const*,cmCustomCommandLine_const*>
                          (pcVar1,pcVar2,pcVar3), !bVar6)) {
      this = lg->GlobalGenerator->CMakeInstance;
      local_c8._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x29;
      local_c8._8_8_ = "Attempt to add a custom rule to output\n  ";
      local_b8._0_8_ = local_90;
      local_b8._8_8_ = local_b8._32_8_;
      local_b8._16_8_ = (pointer)0x21;
      local_b8._24_8_ = "\nwhich already has a custom rule.";
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_c8;
      cmCatViews_abi_cxx11_(&local_100,views_00);
      cmake::IssueMessage(this,FATAL_ERROR,&local_100,local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    bVar6 = false;
    this_02 = this_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._32_8_ != &local_88) {
    operator_delete((void *)local_b8._32_8_,local_88._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    return (cmSourceFile *)this_02;
  }
LAB_003d8183:
  if (this_01 != (cmMakefile *)0x0) {
    cmCustomCommand::SetEscapeAllowMakeVars
              ((cc->_M_t).
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,true);
    bt = local_108;
    cmLocalGenerator::AddSourceOutputs(lg,(cmSourceFile *)this_01,local_d8,Primary,local_108,origin)
    ;
    cmLocalGenerator::AddSourceOutputs(lg,(cmSourceFile *)this_01,local_68,Byproduct,bt,origin);
    local_d0._M_head_impl =
         (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
         _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
    cmSourceFile::SetCustomCommand
              ((cmSourceFile *)this_01,
               (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d0);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d0);
  }
  return (cmSourceFile *)this_01;
}

Assistant:

cmSourceFile* AddCustomCommand(cmLocalGenerator& lg, cmCommandOrigin origin,
                               std::unique_ptr<cmCustomCommand> cc,
                               bool replace)
{
  cmMakefile* mf = lg.GetMakefile();
  const auto& lfbt = cc->GetBacktrace();
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && cc->HasMainDependency()) {
    const auto& main_dependency = cc->GetMainDependency();
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = mf->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = mf->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = lg.GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(
      ComputeCustomCommandRuleFileName(lg, lfbt, outputs[0]));

    // Check if the rule file already exists.
    file = mf->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        lg.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Attempt to add a custom rule to output\n  ", outName,
                   "\nwhich already has a custom rule."),
          lfbt);
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file = mf->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Attach the custom command to the file.
  if (file) {
    cc->SetEscapeAllowMakeVars(true);

    lg.AddSourceOutputs(file, outputs, cmLocalGenerator::OutputRole::Primary,
                        lfbt, origin);
    lg.AddSourceOutputs(file, byproducts,
                        cmLocalGenerator::OutputRole::Byproduct, lfbt, origin);

    file->SetCustomCommand(std::move(cc));
  }
  return file;
}